

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O0

void ext_vdef(void)

{
  if (artificial_cell == 0) {
    if (electrode_current == 0) {
      fputs("    _v = _vec_v[_nd_idx];\n    _PRCELLSTATE_V\n",(FILE *)fcout);
    }
    else {
      fputs("#if EXTRACELLULAR\n",(FILE *)fcout);
      fputs(" _nd = _ml->_nodelist[_iml];\n",(FILE *)fcout);
      fputs(" if (_nd->_extnode) {\n",(FILE *)fcout);
      fputs("    _v = NODEV(_nd) +_nd->_extnode->_v[0];\n",(FILE *)fcout);
      fputs(" }else\n",(FILE *)fcout);
      fputs("#endif\n",(FILE *)fcout);
      fputs(" {\n",(FILE *)fcout);
      fputs("    _v = _vec_v[_nd_idx];\n    _PRCELLSTATE_V\n",(FILE *)fcout);
      fputs(" }\n",(FILE *)fcout);
    }
  }
  return;
}

Assistant:

static void ext_vdef() {
	if (artificial_cell) { return; }
		if (electrode_current) {
			P("#if EXTRACELLULAR\n");
			P(" _nd = _ml->_nodelist[_iml];\n");
			P(" if (_nd->_extnode) {\n");
			P("    _v = NODEV(_nd) +_nd->_extnode->_v[0];\n");
			P(" }else\n");
			P("#endif\n");
			P(" {\n");
#if CACHEVEC == 0
			P("    _v = NODEV(_nd);\n");
#else
			P("    _v = _vec_v[_nd_idx];\n    _PRCELLSTATE_V\n");
#endif
			
			P(" }\n");
		}else{
#if CACHEVEC == 0
			P(" _nd = _ml->_nodelist[_iml];\n");
			P(" _v = NODEV(_nd);\n");
#else
			P("    _v = _vec_v[_nd_idx];\n    _PRCELLSTATE_V\n");
#endif
		}
}